

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::isCodeBlockLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,CTokenGroupIter *i,
          CTokenGroupIter end)

{
  size_type *psVar1;
  long lVar2;
  undefined1 uVar3;
  char cVar4;
  _List_node_base *p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  CTokenGroupIter *pCVar7;
  long lVar8;
  undefined8 unaff_RBP;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  type local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (*(long **)(*(long *)this + 0x10) != (long *)0x0) {
    cVar4 = (**(code **)(**(long **)(*(long *)this + 0x10) + 0x48))();
    if (cVar4 == '\0') {
      if (*(long **)(*(long *)this + 0x10) == (long *)0x0) goto LAB_00130aa7;
      p_Var5 = (_List_node_base *)(**(code **)(**(long **)(*(long *)this + 0x10) + 0x38))(&local_70)
      ;
      if (local_70 != (type)0x0) {
        if (*(long **)(*(long *)this + 0x10) == (long *)0x0) goto LAB_00130aa7;
        p_Var5 = (_List_node_base *)(**(code **)(**(long **)(*(long *)this + 0x10) + 0x40))();
        if ((char)p_Var5 != '\0') {
          if (*(long **)(*(long *)this + 0x10) == (long *)0x0) goto LAB_00130aa7;
          (**(code **)(**(long **)(*(long *)this + 0x10) + 0x38))(&local_70);
          if (local_70 == (type)0x0) {
            __assert_fail("ptr_","/usr/include/boost/optional/detail/optional_reference_spec.hpp",
                          0x99,
                          "T &boost::optional<const std::basic_string<char> &>::operator*() const [T = const std::basic_string<char> &]"
                         );
          }
          p_Var5 = *(_List_node_base **)((long)local_70 + 8);
          if ((_List_node_base *)0x3 < p_Var5) {
            lVar2 = *(long *)local_70;
            lVar8 = 0;
            while (*(char *)(lVar2 + lVar8) == ' ') {
              lVar8 = lVar8 + 1;
              if (lVar8 == 4) {
                *(undefined8 *)this = **(undefined8 **)this;
                local_70 = (type)&local_68._M_string_length;
                std::__cxx11::string::
                _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((string *)&local_70,lVar2 + 4,
                           &((type *)&p_Var5->_M_next)->m_initialized + lVar2);
                psVar1 = (size_type *)
                         ((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
                *(size_type **)&(__return_storage_ptr__->super_type).m_storage.dummy_ = psVar1;
                if (local_70 == (type)&local_68._M_string_length) {
                  *psVar1 = local_68._M_string_length;
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x18) =
                       local_68.field_2._M_allocated_capacity;
                }
                else {
                  (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ = local_70;
                  *(size_type *)
                   ((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
                       local_68._M_string_length;
                }
                *(pointer *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
                     local_68._M_dataplus._M_p;
                (__return_storage_ptr__->super_type).m_initialized = true;
                return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_68._M_dataplus._M_p;
              }
            }
          }
        }
      }
    }
    else {
      pCVar7 = (CTokenGroupIter *)**(long **)this;
      *(CTokenGroupIter **)this = pCVar7;
      if (pCVar7 != i) {
        isCodeBlockLine_abi_cxx11_
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,this,i,end);
        uVar3 = local_70._0_1_;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(CONCAT71((int7)((ulong)unaff_RBP >> 8),local_70._0_1_) & 0xffffffff);
        if (local_70._0_1_ == '\x01') {
          std::operator+(&local_48,"\n",&local_68);
          psVar1 = (size_type *)
                   ((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10);
          *(size_type **)&(__return_storage_ptr__->super_type).m_storage.dummy_ = psVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p == &local_48.field_2) {
            *psVar1 = local_48.field_2._M_allocated_capacity;
            *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x18) =
                 local_48.field_2._8_8_;
          }
          else {
            (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ =
                 (type)local_48._M_dataplus._M_p;
            *(size_type *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x10) =
                 local_48.field_2._M_allocated_capacity;
          }
          *(size_type *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) =
               local_48._M_string_length;
          (__return_storage_ptr__->super_type).m_initialized = true;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT71((int7)(local_48._M_string_length >> 8),local_70._0_1_);
        }
        if ((((ulong)paVar6 & 1) != 0) &&
           (paVar6 = &local_68.field_2,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_68._M_dataplus._M_p != paVar6)) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          paVar6 = extraout_RAX;
        }
        if (uVar3 != '\0') {
          return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)paVar6;
        }
        pCVar7 = *(CTokenGroupIter **)this;
      }
      p_Var5 = pCVar7[1]._M_node;
      *(_List_node_base **)this = p_Var5;
    }
    (__return_storage_ptr__->super_type).m_initialized = false;
    return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)p_Var5;
  }
LAB_00130aa7:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<markdown::Token>::operator->() const [T = markdown::Token]"
               );
}

Assistant:

optional<std::string> isCodeBlockLine(CTokenGroupIter& i, CTokenGroupIter end) {
	if ((*i)->isBlankLine()) {
		// If we get here, we're already in a code block.
		++i;
		if (i!=end) {
			optional<std::string> r=isCodeBlockLine(i, end);
			if (r) return std::string("\n"+*r);
		}
		--i;
	} else if ((*i)->text() && (*i)->canContainMarkup()) {
		const std::string& line(*(*i)->text());
		if (line.length()>=4) {
			std::string::const_iterator si=line.begin(), sie=si+4;
			while (si!=sie && *si==' ') ++si;
			if (si==sie) {
				++i;
				return std::string(si, line.end());
			}
		}
	}
	return none;
}